

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.hpp
# Opt level: O3

string * string_utils::join(string *__return_storage_ptr__,
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *strings,string *split)

{
  pointer pbVar1;
  ulong uVar2;
  long lVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pbVar1 = (strings->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((strings->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar1) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,
                 *(ulong *)((long)&(pbVar1->_M_dataplus)._M_p + lVar3));
      if (lVar3 != 0) {
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)(split->_M_dataplus)._M_p);
      }
      uVar2 = uVar2 + 1;
      pbVar1 = (strings->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x20;
    } while (uVar2 < (ulong)((long)(strings->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5))
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

static string join(const vector<string>& strings, string split) {
    string res;
    for (int i = 0; i < strings.size(); i++) {
      res += strings[i];
      if (i != 0) res += split;
    }
    return res;
  }